

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrbtree.c
# Opt level: O0

xrbt_iter_t xrbt_find(xrbt_t *tr,void *pdata)

{
  int iVar1;
  xrbt_iter_t pxStack_28;
  int result;
  xrbt_iter_t iter;
  void *pdata_local;
  xrbt_t *tr_local;
  
  pxStack_28 = tr->root;
  while( true ) {
    while( true ) {
      if (pxStack_28 == (xrbt_iter_t)0x0) {
        return (xrbt_iter_t)0x0;
      }
      iVar1 = (*tr->compare_cb)(pxStack_28 + 1,pdata);
      if (iVar1 < 1) break;
      pxStack_28 = pxStack_28->rb_right;
    }
    if (-1 < iVar1) break;
    pxStack_28 = pxStack_28->rb_left;
  }
  return pxStack_28;
}

Assistant:

xrbt_iter_t xrbt_find(xrbt_t* tr, const void* pdata)
{
    xrbt_iter_t iter = tr->root;
    int result;

    while (iter)
    {
        result = tr->compare_cb(xrbt_iter_data(iter), (void*)pdata);

        if (result > 0)
            iter = iter->rb_right;
        else if (result < 0)
            iter = iter->rb_left;
        else
            return iter;
    }

    return NULL;
}